

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_bmnz_v_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)wd;
  uVar1 = (env->active_fpu).fpr[uVar3].fd;
  uVar2 = *(ulong *)((long)(env->active_fpu).fpr + uVar3 * 0x10 + 8);
  (env->active_fpu).fpr[uVar3].fd =
       ((env->active_fpu).fpr[ws].fd ^ uVar1) & (env->active_fpu).fpr[wt].fd ^ uVar1;
  *(ulong *)((long)(env->active_fpu).fpr + uVar3 * 0x10 + 8) =
       (*(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8) ^ uVar2) &
       *(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) ^ uVar2;
  return;
}

Assistant:

void helper_msa_bmnz_v(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0] = UNSIGNED(                                                     \
        ((pwd->d[0] & (~pwt->d[0])) | (pws->d[0] & pwt->d[0])), DF_DOUBLE);
    pwd->d[1] = UNSIGNED(                                                     \
        ((pwd->d[1] & (~pwt->d[1])) | (pws->d[1] & pwt->d[1])), DF_DOUBLE);
}